

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjComputeTruthTableStart(Gia_Man_t *p,int nVarsMax)

{
  undefined4 uVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  void **ppvVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  Vec_Wrd_t *pVVar11;
  word *__s;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  size_t __size;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    p->nTtVars = nVarsMax;
    iVar5 = 1 << ((char)nVarsMax - 6U & 0x1f);
    if (nVarsMax < 7) {
      iVar5 = 1;
    }
    p->nTtWords = iVar5;
    uVar17 = 6;
    if (6 < nVarsMax) {
      uVar17 = (ulong)(uint)nVarsMax;
    }
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0x100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(0x400);
    pVVar6->pArray = piVar7;
    p->vTtNodes = pVVar6;
    iVar5 = (int)uVar17;
    iVar13 = iVar5 + -5;
    uVar16 = 1 << ((byte)iVar13 & 0x1f);
    ppvVar8 = (void **)malloc(((long)(int)uVar16 * 4 + 8) * uVar17);
    lVar9 = uVar17 * 8;
    uVar12 = 0;
    do {
      ppvVar8[uVar12] = (void *)((long)ppvVar8 + lVar9);
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + (long)(int)uVar16 * 4;
    } while (uVar17 != uVar12);
    pVVar10 = (Vec_Ptr_t *)malloc(0x10);
    pVVar10->nSize = iVar5;
    pVVar10->nCap = iVar5;
    pVVar10->pArray = ppvVar8;
    auVar21 = _DAT_008403e0;
    auVar20 = _DAT_008403d0;
    auVar4 = _DAT_008403c0;
    uVar12 = (ulong)uVar16;
    lVar9 = uVar12 - 1;
    auVar18._8_4_ = (int)lVar9;
    auVar18._0_8_ = lVar9;
    auVar18._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_008403e0;
    do {
      pvVar2 = ppvVar8[uVar14];
      iVar5 = auVar18._0_4_;
      iVar23 = auVar18._4_4_;
      if (uVar14 < 5) {
        if (iVar13 != 0x1f) {
          uVar1 = (&DAT_00999ca0)[uVar14];
          uVar15 = 0;
          auVar22 = auVar20;
          auVar24 = auVar4;
          do {
            auVar25 = auVar22 ^ auVar21;
            if ((bool)(~(auVar25._4_4_ == iVar23 && iVar5 < auVar25._0_4_ || iVar23 < auVar25._4_4_)
                      & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar15 * 4) = uVar1;
            }
            if ((auVar25._12_4_ != auVar18._12_4_ || auVar25._8_4_ <= auVar18._8_4_) &&
                auVar25._12_4_ <= auVar18._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar15 * 4 + 4) = uVar1;
            }
            iVar26 = SUB164(auVar24 ^ auVar21,4);
            if (iVar26 <= iVar23 && (iVar26 != iVar23 || SUB164(auVar24 ^ auVar21,0) <= iVar5)) {
              *(undefined4 *)((long)pvVar2 + uVar15 * 4 + 8) = uVar1;
              *(undefined4 *)((long)pvVar2 + uVar15 * 4 + 0xc) = uVar1;
            }
            uVar15 = uVar15 + 4;
            lVar9 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar9 + 4;
            lVar9 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar9 + 4;
          } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar15);
        }
      }
      else if (iVar13 != 0x1f) {
        uVar16 = 1 << ((char)uVar14 - 5U & 0x1f);
        uVar15 = 0;
        auVar25 = auVar20;
        do {
          bVar3 = iVar5 < SUB164(auVar25 ^ auVar21,0);
          iVar26 = SUB164(auVar25 ^ auVar21,4);
          if ((bool)(~(iVar23 < iVar26 || iVar26 == iVar23 && bVar3) & 1)) {
            *(uint *)((long)pvVar2 + uVar15 * 4) = -(uint)((uVar16 & (uint)uVar15) != 0);
          }
          if (iVar23 >= iVar26 && (iVar26 != iVar23 || !bVar3)) {
            *(uint *)((long)pvVar2 + uVar15 * 4 + 4) = -(uint)(((uint)uVar15 + 1 & uVar16) != 0);
          }
          uVar15 = uVar15 + 2;
          lVar9 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar9 + 2;
        } while ((uVar12 + 1 & 0x1fffffffe) != uVar15);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar17);
    p->vTtInputs = pVVar10;
    lVar9 = (long)p->nTtWords;
    pVVar11 = (Vec_Wrd_t *)malloc(0x10);
    iVar5 = (int)(lVar9 << 6);
    pVVar11->nCap = iVar5;
    if (lVar9 == 0) {
      __size = 0;
      __s = (word *)0x0;
    }
    else {
      __size = lVar9 << 9;
      __s = (word *)malloc(__size);
    }
    pVVar11->pArray = __s;
    pVVar11->nSize = iVar5;
    memset(__s,0,__size);
    p->vTtMemory = pVVar11;
    iVar5 = p->nObjs;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar17 = 0x10;
    if (0xe < iVar5 + 999U) {
      uVar17 = (ulong)(iVar5 + 1000);
    }
    iVar5 = (int)uVar17;
    pVVar6->nCap = iVar5;
    if (iVar5 == 0) {
      pVVar6->pArray = (int *)0x0;
      p->vTtNums = pVVar6;
    }
    else {
      piVar7 = (int *)malloc((long)iVar5 << 2);
      pVVar6->pArray = piVar7;
      p->vTtNums = pVVar6;
      auVar4 = _DAT_008403e0;
      if (0 < iVar5) {
        lVar9 = uVar17 - 1;
        auVar19._8_4_ = (int)lVar9;
        auVar19._0_8_ = lVar9;
        auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar17 = 0;
        auVar19 = auVar19 ^ _DAT_008403e0;
        auVar20 = _DAT_008403c0;
        auVar21 = _DAT_008403d0;
        do {
          auVar18 = auVar21 ^ auVar4;
          iVar13 = auVar19._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar13 && auVar19._0_4_ < auVar18._0_4_ ||
                      iVar13 < auVar18._4_4_) & 1)) {
            piVar7[uVar17] = -1000000000;
          }
          if ((auVar18._12_4_ != auVar19._12_4_ || auVar18._8_4_ <= auVar19._8_4_) &&
              auVar18._12_4_ <= auVar19._12_4_) {
            piVar7[uVar17 + 1] = -1000000000;
          }
          auVar18 = auVar20 ^ auVar4;
          iVar23 = auVar18._4_4_;
          if (iVar23 <= iVar13 && (iVar23 != iVar13 || auVar18._0_4_ <= auVar19._0_4_)) {
            piVar7[uVar17 + 2] = -1000000000;
            piVar7[uVar17 + 3] = -1000000000;
          }
          uVar17 = uVar17 + 4;
          lVar9 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar9 + 4;
          lVar9 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar9 + 4;
        } while ((iVar5 + 3U & 0xfffffffc) != uVar17);
      }
    }
    pVVar6->nSize = iVar5;
    return;
  }
  __assert_fail("p->vTtMemory == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                ,0x14a,"void Gia_ObjComputeTruthTableStart(Gia_Man_t *, int)");
}

Assistant:

void Gia_ObjComputeTruthTableStart( Gia_Man_t * p, int nVarsMax )
{
    assert( p->vTtMemory == NULL );
    p->nTtVars   = nVarsMax;
    p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
    p->vTtNodes  = Vec_IntAlloc( 256 );
    p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
    p->vTtMemory = Vec_WrdStart( p->nTtWords * 64 );
    p->vTtNums   = Vec_IntAlloc( Gia_ManObjNum(p) + 1000 );
    Vec_IntFill( p->vTtNums, Vec_IntCap(p->vTtNums), -ABC_INFINITY );
}